

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void reallymarkobject(global_State *g,GCObject *o)

{
  GCObject *pGVar1;
  l_mem lVar2;
  GCObject **ppGVar3;
  byte bVar4;
  byte bVar5;
  
LAB_0010c4e8:
  lVar2 = objsize(o);
  g->GCmarked = g->GCmarked + lVar2;
  switch(o->tt) {
  case '\a':
    if (*(short *)&o->field_0xa != 0) goto switchD_0010c507_caseD_5;
    pGVar1 = *(GCObject **)&o[1].tt;
    if ((pGVar1 != (GCObject *)0x0) && ((pGVar1->marked & 0x18) != 0)) {
      reallymarkobject(g,pGVar1);
    }
  case '\x04':
  case '\x14':
    o->marked = o->marked & 199 | 0x20;
    break;
  case '\t':
    goto switchD_0010c507_caseD_9;
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    break;
  default:
    if (o->tt != '&') {
      return;
    }
  case '\x05':
  case '\x06':
  case '\b':
  case '\n':
switchD_0010c507_caseD_5:
    ppGVar3 = getgclist(o);
    *ppGVar3 = g->gray;
    g->gray = o;
    o->marked = o->marked & 199;
  }
  return;
switchD_0010c507_caseD_9:
  pGVar1 = o[1].next;
  bVar4 = o->marked & 199;
  bVar5 = bVar4 + 0x20;
  if (pGVar1 != (GCObject *)&o[1].tt) {
    bVar5 = bVar4;
  }
  o->marked = bVar5;
  if ((pGVar1->tt & 0x40) == 0) {
    return;
  }
  o = pGVar1->next;
  if ((o->marked & 0x18) == 0) {
    return;
  }
  goto LAB_0010c4e8;
}

Assistant:

static void reallymarkobject (global_State *g, GCObject *o) {
  g->GCmarked += objsize(o);
  switch (o->tt) {
    case LUA_VSHRSTR:
    case LUA_VLNGSTR: {
      set2black(o);  /* nothing to visit */
      break;
    }
    case LUA_VUPVAL: {
      UpVal *uv = gco2upv(o);
      if (upisopen(uv))
        set2gray(uv);  /* open upvalues are kept gray */
      else
        set2black(uv);  /* closed upvalues are visited here */
      markvalue(g, uv->v.p);  /* mark its content */
      break;
    }
    case LUA_VUSERDATA: {
      Udata *u = gco2u(o);
      if (u->nuvalue == 0) {  /* no user values? */
        markobjectN(g, u->metatable);  /* mark its metatable */
        set2black(u);  /* nothing else to mark */
        break;
      }
      /* else... */
    }  /* FALLTHROUGH */
    case LUA_VLCL: case LUA_VCCL: case LUA_VTABLE:
    case LUA_VTHREAD: case LUA_VPROTO: {
      linkobjgclist(o, g->gray);  /* to be visited later */
      break;
    }
    default: lua_assert(0); break;
  }
}